

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::SaveServerlist(CServerBrowser *this)

{
  int iVar1;
  IStorage *pIVar2;
  undefined4 extraout_var;
  CServerBrowser *in_RDI;
  long in_FS_OFFSET;
  int i;
  IOHANDLE File;
  CJsonWriter Writer;
  char *pName;
  CJsonWriter *this_00;
  int local_58;
  IOINTERNAL local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = Storage(in_RDI);
  pName = (char *)0x0;
  this_00 = (CJsonWriter *)0x0;
  iVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])(pIVar2,s_pFilename,2,0,0);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    CJsonWriter::CJsonWriter((CJsonWriter *)in_RDI,local_38);
    CJsonWriter::BeginObject(this_00);
    CJsonWriter::WriteAttribute(this_00,pName);
    CJsonWriter::BeginArray(this_00);
    for (local_58 = 0; local_58 < in_RDI->m_aServerlist[0].m_NumServers; local_58 = local_58 + 1) {
      CJsonWriter::WriteStrValue(this_00,pName);
    }
    CJsonWriter::EndArray(this_00);
    CJsonWriter::EndObject(this_00);
    CJsonWriter::~CJsonWriter(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CServerBrowser::SaveServerlist()
{
	IOHANDLE File = Storage()->OpenFile(s_pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE);
	if(!File)
		return;

	CJsonWriter Writer(File);
	Writer.BeginObject(); // root
	Writer.WriteAttribute("serverlist");
	Writer.BeginArray();
	for(int i = 0; i < m_aServerlist[IServerBrowser::TYPE_INTERNET].m_NumServers; ++i)
		Writer.WriteStrValue(m_aServerlist[IServerBrowser::TYPE_INTERNET].m_ppServerlist[i]->m_Info.m_aAddress);
	Writer.EndArray();
	Writer.EndObject();
}